

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O1

void __thiscall
cppcms::http::cookie::cookie
          (cookie *this,string *name,string *value,uint age,string *path,string *domain,
          string *comment)

{
  pointer pcVar1;
  
  (this->d).ptr_ = (_data *)0x0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value_,pcVar1,pcVar1 + value->_M_string_length);
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path_,pcVar1,pcVar1 + path->_M_string_length);
  (this->domain_)._M_dataplus._M_p = (pointer)&(this->domain_).field_2;
  pcVar1 = (domain->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->domain_,pcVar1,pcVar1 + domain->_M_string_length);
  (this->comment_)._M_dataplus._M_p = (pointer)&(this->comment_).field_2;
  pcVar1 = (comment->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->comment_,pcVar1,pcVar1 + comment->_M_string_length);
  this->max_age_ = age;
  *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 & 0xffffff80 | 2;
  return;
}

Assistant:

cookie::cookie(std::string name,std::string value,unsigned age,std::string path,std::string domain,std::string comment) :
	name_(name), value_(value), path_(path),domain_(domain),comment_(comment),max_age_(age), secure_(0), has_age_(1), has_expiration_(0), httponly_(0), samesite_none_(0), samesite_lax_(0), samesite_strict_(0)
{
}